

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setLineEdit(QComboBox *this,QLineEdit *edit)

{
  QArrayDataPointer<char16_t> *this_00;
  QComboBoxPrivate *this_01;
  QWidgetPrivate *pQVar1;
  QCompleter *pQVar2;
  QWidget *this_02;
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  int iStack_48;
  int iStack_44;
  int iStack_40;
  LayoutDirection local_3c;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (edit == (QLineEdit *)0x0) {
    local_58._8_4_ = Inactive;
    local_3c = LeftToRight;
    uStack_4c = 0;
    iStack_48 = 0;
    iStack_44 = 0;
    iStack_40 = 0;
    local_38 = "default";
    QMessageLogger::warning(local_58 + 8,"QComboBox::setLineEdit: cannot set a 0 line edit");
  }
  else {
    this_01 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
    if (this_01->lineEdit != edit) {
      this_00 = (QArrayDataPointer<char16_t> *)(local_58 + 8);
      currentText((QString *)this_00,this);
      QLineEdit::setText(edit,(QString *)this_00);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      if (this_01->lineEdit != (QLineEdit *)0x0) {
        (**(code **)(*(long *)&this_01->lineEdit->super_QWidget + 0x20))();
      }
      this_01->lineEdit = edit;
      pQVar1 = qt_widget_private(&edit->super_QWidget);
      pQVar1->field_0x253 = pQVar1->field_0x253 | 4;
      this_02 = &this_01->lineEdit->super_QWidget;
      if (*(QComboBox **)(*(long *)&this_02->field_0x8 + 0x10) != this) {
        QWidget::setParent(this_02,&this->super_QWidget);
        this_02 = &this_01->lineEdit->super_QWidget;
      }
      local_58._8_4_ = 0x3b18c0;
      uStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      type = (ConnectionType)this_01;
      QObjectPrivate::connect<void(QLineEdit::*)(),void(QComboBoxPrivate::*)()>
                ((Object *)local_58,(offset_in_QLineEdit_to_subr)this_02,
                 (Object *)QLineEdit::returnPressed,0,type);
      QMetaObject::Connection::~Connection((Connection *)local_58);
      local_58._8_4_ = 0x3b165e;
      uStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      QObjectPrivate::connect<void(QLineEdit::*)(),void(QComboBoxPrivate::*)()>
                ((Object *)(local_68 + 8),(offset_in_QLineEdit_to_subr)this_01->lineEdit,
                 (Object *)QLineEdit::editingFinished,0,type);
      QMetaObject::Connection::~Connection((Connection *)(local_68 + 8));
      local_58._8_4_ = 0x3b287e;
      uStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      QObject::connect<void(QLineEdit::*)(QString_const&),void(QComboBox::*)(QString_const&)>
                ((Object *)local_68,(offset_in_QLineEdit_to_subr)this_01->lineEdit,
                 (ContextType *)QLineEdit::textChanged,(offset_in_QComboBox_to_subr *)0x0,
                 (ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_68);
      local_58._8_4_ = 0x3b2896;
      uStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      QObject::connect<void(QLineEdit::*)(QString_const&),void(QComboBox::*)(QString_const&)>
                ((Object *)(local_78 + 8),(offset_in_QLineEdit_to_subr)this_01->lineEdit,
                 (ContextType *)QLineEdit::textChanged,(offset_in_QComboBox_to_subr *)0x0,
                 (ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)(local_78 + 8));
      local_58._8_4_ = 0x3b7b84;
      uStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      QObjectPrivate::connect<void(QLineEdit::*)(int,int),void(QComboBoxPrivate::*)()>
                ((Object *)local_78,(offset_in_QLineEdit_to_subr)this_01->lineEdit,
                 (Object *)QLineEdit::cursorPositionChanged,0,type);
      QMetaObject::Connection::~Connection((Connection *)local_78);
      local_58._8_4_ = 0x3b7b84;
      uStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      QObjectPrivate::connect<void(QLineEdit::*)(),void(QComboBoxPrivate::*)()>
                ((Object *)(local_88 + 8),(offset_in_QLineEdit_to_subr)this_01->lineEdit,
                 (Object *)QLineEdit::selectionChanged,0,type);
      QMetaObject::Connection::~Connection((Connection *)(local_88 + 8));
      local_58._8_4_ = 0x3b7b84;
      uStack_4c = 0;
      iStack_48 = 0;
      iStack_44 = 0;
      QObjectPrivate::connect<void(QWidgetLineControl::*)(),void(QComboBoxPrivate::*)()>
                ((Object *)local_88,
                 *(offset_in_QWidgetLineControl_to_subr *)
                  (*(long *)&(this_01->lineEdit->super_QWidget).field_0x8 + 600),
                 (Object *)QWidgetLineControl::updateMicroFocus,0,type);
      QMetaObject::Connection::~Connection((Connection *)local_88);
      QLineEdit::setFrame(this_01->lineEdit,false);
      QWidget::setContextMenuPolicy(&this_01->lineEdit->super_QWidget,NoContextMenu);
      QWidget::setFocusProxy(&this_01->lineEdit->super_QWidget,&this->super_QWidget);
      QWidget::setAttribute(&this_01->lineEdit->super_QWidget,WA_MacShowFocusRect,false);
      pQVar2 = QLineEdit::completer(this_01->lineEdit);
      if (pQVar2 == (QCompleter *)0x0) {
        pQVar2 = (QCompleter *)operator_new(0x10);
        QCompleter::QCompleter(pQVar2,this_01->model,(QObject *)this_01->lineEdit);
        QCompleter::setCaseSensitivity(pQVar2,CaseInsensitive);
        QCompleter::setCompletionMode(pQVar2,InlineCompletion);
        QCompleter::setCompletionColumn(pQVar2,this_01->modelColumn);
        setCompleter(this,pQVar2);
      }
      QWidget::setAttribute(&this->super_QWidget,WA_InputMethodEnabled,true);
      QComboBoxPrivate::updateLayoutDirection(this_01);
      QComboBoxPrivate::updateLineEditGeometry(this_01);
      if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
        QWidget::show(&this_01->lineEdit->super_QWidget);
      }
      QWidget::update(&this->super_QWidget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setLineEdit(QLineEdit *edit)
{
    Q_D(QComboBox);
    if (Q_UNLIKELY(!edit)) {
        qWarning("QComboBox::setLineEdit: cannot set a 0 line edit");
        return;
    }

    if (edit == d->lineEdit)
        return;

    edit->setText(currentText());
    delete d->lineEdit;

    d->lineEdit = edit;
#ifndef QT_NO_IM
    qt_widget_private(d->lineEdit)->inheritsInputMethodHints = 1;
#endif
    if (d->lineEdit->parent() != this)
        d->lineEdit->setParent(this);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::returnPressed,
                            d, &QComboBoxPrivate::returnPressed);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::editingFinished,
                            d, &QComboBoxPrivate::editingFinished);
    connect(d->lineEdit, &QLineEdit::textChanged, this, &QComboBox::editTextChanged);
    connect(d->lineEdit, &QLineEdit::textChanged, this, &QComboBox::currentTextChanged);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::cursorPositionChanged,
                            d, &QComboBoxPrivate::updateMicroFocus);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::selectionChanged,
                            d, &QComboBoxPrivate::updateMicroFocus);
    QObjectPrivate::connect(d->lineEdit->d_func()->control, &QWidgetLineControl::updateMicroFocus,
                            d, &QComboBoxPrivate::updateMicroFocus);
    d->lineEdit->setFrame(false);
    d->lineEdit->setContextMenuPolicy(Qt::NoContextMenu);
    d->updateFocusPolicy();
    d->lineEdit->setFocusProxy(this);
    d->lineEdit->setAttribute(Qt::WA_MacShowFocusRect, false);

#if QT_CONFIG(completer)
    // create a default completer
    if (!d->lineEdit->completer()) {
        QCompleter *completer = new QCompleter(d->model, d->lineEdit);
        completer->setCaseSensitivity(Qt::CaseInsensitive);
        completer->setCompletionMode(QCompleter::InlineCompletion);
        completer->setCompletionColumn(d->modelColumn);

#ifdef QT_KEYPAD_NAVIGATION
        // Editable combo boxes will have a completer that is set to UnfilteredPopupCompletion.
        // This means that when the user enters edit mode they are immediately presented with a
        // list of possible completions.
        if (QApplicationPrivate::keypadNavigationEnabled())
            completer->setCompletionMode(QCompleter::UnfilteredPopupCompletion);
#endif
        // sets up connections
        setCompleter(completer);
    }
#endif

    setAttribute(Qt::WA_InputMethodEnabled);
    d->updateLayoutDirection();
    d->updateLineEditGeometry();
    if (isVisible())
        d->lineEdit->show();

    update();
}